

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationPrimitiveDiscardTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::tessellation::anon_unknown_0::test
          (TestStatus *__return_storage_ptr__,anon_unknown_0 *this,Context *context,
          CaseDefinition caseDef)

{
  ostringstream *poVar1;
  ProgramCollection<vk::ProgramBinary> *pPVar2;
  undefined1 auVar3 [16];
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  VkDevice pVVar4;
  DeviceInterface *pDVar5;
  pointer pfVar6;
  tessellation *this_00;
  Context *pCVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  InstanceInterface *pIVar11;
  VkPhysicalDevice pVVar12;
  Allocator *allocator;
  float (*pafVar13) [3];
  TextureFormat TVar14;
  DescriptorSetLayoutBuilder *this_01;
  DescriptorPoolBuilder *this_02;
  DescriptorSetUpdateBuilder *this_03;
  GraphicsPipelineBuilder *pGVar15;
  ProgramBinary *pPVar16;
  long lVar17;
  ulong uVar18;
  ConstPixelBufferAccess *access;
  float *outer;
  void *__buf;
  TestStatus *__return_storage_ptr___00;
  int y;
  deUint32 dVar19;
  char *pcVar20;
  deUint32 dVar21;
  TessPrimitiveType primitiveType;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_04;
  long lVar22;
  int j;
  int iVar23;
  ulong uVar24;
  VkDeviceSize bufferSize;
  int x;
  int iVar25;
  bool bVar26;
  float fVar27;
  VkExtent3D extent;
  VkImageSubresourceLayers subresourceLayers;
  int lastWhitePixelRow;
  VkDeviceSize local_858;
  VkDevice local_850;
  Location local_848;
  IVec2 renderSize;
  int lastWhitePixelColumnOnSecondToLastWhitePixelRow;
  undefined8 local_830;
  uint local_828;
  int secondToLastWhitePixelRow;
  TestStatus *local_820;
  DeviceInterface *local_818;
  ulong local_810;
  vector<float,_std::allocator<float>_> attributes;
  RefBase<vk::VkCommandBuffer_s_*> local_7d8;
  string local_7b8;
  ulong local_798;
  tessellation *local_790;
  deUint32 local_784;
  string local_780;
  string local_760;
  Context *local_740;
  ulong local_738;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_730;
  ulong local_710;
  VkQueue local_708;
  Context *local_700;
  ulong local_6f8;
  ConstPixelBufferAccess local_6f0;
  RefBase<vk::Handle<(vk::HandleType)17>_> local_6c8;
  Buffer vertexBuffer;
  float choices [6] [3];
  float local_60c;
  RefBase<vk::Handle<(vk::HandleType)16>_> local_498;
  RefBase<vk::Handle<(vk::HandleType)22>_> local_478;
  RefBase<vk::Handle<(vk::HandleType)19>_> local_458;
  ConstPixelBufferAccess imagePixelAccess;
  VkDescriptorBufferInfo resultBufferInfo;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_3f8;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_3d8;
  RefBase<vk::Handle<(vk::HandleType)23>_> local_3b8;
  RefBase<vk::Handle<(vk::HandleType)13>_> local_398;
  RefBase<vk::Handle<(vk::HandleType)21>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  Image colorAttachmentImage;
  Buffer resultBuffer;
  undefined1 *local_298;
  undefined1 *puStack_290;
  Vector<float,_4> local_288;
  Buffer colorBuffer;
  string local_240;
  string local_220;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  Vector<int,_2> local_1c0;
  undefined1 local_1b8 [8];
  undefined8 uStack_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [23];
  
  local_738 = (ulong)context >> 0x20;
  pIVar11 = Context::getInstanceInterface((Context *)this);
  pVVar12 = Context::getPhysicalDevice((Context *)this);
  requireFeatures(pIVar11,pVVar12,9);
  local_818 = Context::getDeviceInterface((Context *)this);
  local_850 = Context::getDevice((Context *)this);
  local_708 = Context::getUniversalQueue((Context *)this);
  local_784 = Context::getUniversalQueueFamilyIndex((Context *)this);
  allocator = Context::getDefaultAllocator((Context *)this);
  attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pafVar13 = choices;
  local_710 = caseDef._0_8_ >> 0x28;
  for (lVar17 = 0; lVar17 != 6; lVar17 = lVar17 + 1) {
    for (lVar22 = 0; lVar22 != 0xc; lVar22 = lVar22 + 4) {
      pcVar20 = "N3vkt17FunctionInstance1INS_12tessellation12_GLOBAL__N_114CaseDefinitionEEE" +
                lVar22 + 0x4a;
      if (lVar22 == 0) {
        pcVar20 = (char *)(&tessellation::(anonymous_namespace)::genAttributes(bool)::baseTessLevels
                          + lVar17);
      }
      if ((local_710 & 1) == 0) {
        pcVar20 = (char *)(&tessellation::(anonymous_namespace)::genAttributes(bool)::baseTessLevels
                          + lVar17);
      }
      *(undefined4 *)((long)*pafVar13 + lVar22) = *(undefined4 *)pcVar20;
    }
    pafVar13 = pafVar13 + 1;
  }
  local_820 = __return_storage_ptr__;
  local_798 = caseDef._0_8_;
  local_740 = context;
  local_700 = (Context *)this;
  iVar9 = intPow(3,0x9bdac0);
  local_810 = CONCAT44(local_810._4_4_,iVar9);
  fVar27 = 2.0 / (float)iVar9;
  uVar10 = 0;
  iVar25 = 0;
  local_858 = CONCAT44(local_858._4_4_,fVar27);
  local_830 = CONCAT44(local_830._4_4_,(float)iVar9);
  while( true ) {
    pCVar7 = local_740;
    uVar18 = (ulong)uVar10;
    uStack_1b0 = (pointer)CONCAT44(uStack_1b0._4_4_,uVar10);
    if (uVar10 == 3) break;
    local_6f8 = uVar18;
    for (dVar19 = 0; uStack_1b0 = (pointer)CONCAT44(dVar19,(float)uStack_1b0), dVar19 != 3;
        dVar19 = dVar19 + 1) {
      uVar10 = 0;
      local_848.m_binding = dVar19;
      while( true ) {
        local_1a8[0]._0_4_ = uVar10;
        if (uVar10 == 3) break;
        iVar9 = 0;
        local_828 = uVar10;
        while( true ) {
          local_1a8[0]._4_4_ = iVar9;
          if (iVar9 == 3) break;
          dVar21 = 0;
          local_790 = (tessellation *)CONCAT44(local_790._4_4_,iVar9);
          while( true ) {
            local_1b8._0_4_ = dVar21;
            if (dVar21 == 3) break;
            dVar19 = 0;
            while( true ) {
              local_1b8._4_4_ = dVar19;
              if (dVar19 == 3) break;
              pafVar13 = choices;
              for (lVar17 = 0; lVar17 != 6; lVar17 = lVar17 + 1) {
                std::vector<float,_std::allocator<float>_>::push_back
                          (&attributes,*pafVar13 + *(int *)(local_1b8 + lVar17 * 4));
                pafVar13 = pafVar13 + 1;
                fVar27 = (float)local_858;
              }
              iVar23 = iVar25 / (int)(deUint32)local_810;
              iVar9 = iVar25 % (int)(deUint32)local_810;
              vertexBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
              m_internal._0_4_ = fVar27;
              std::vector<float,_std::allocator<float>_>::emplace_back<float>
                        (&attributes,(float *)&vertexBuffer);
              vertexBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
              m_internal._0_4_ = (float)local_858;
              std::vector<float,_std::allocator<float>_>::emplace_back<float>
                        (&attributes,(float *)&vertexBuffer);
              fVar27 = (float)iVar9 / (float)local_830;
              vertexBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
              m_internal._0_4_ = fVar27 + fVar27 + -1.0;
              std::vector<float,_std::allocator<float>_>::emplace_back<float>
                        (&attributes,(float *)&vertexBuffer);
              fVar27 = (float)iVar23 / (float)local_830;
              vertexBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
              m_internal._0_4_ = fVar27 + fVar27 + -1.0;
              std::vector<float,_std::allocator<float>_>::emplace_back<float>
                        (&attributes,(float *)&vertexBuffer);
              iVar25 = iVar25 + 1;
              dVar19 = dVar19 + 1;
              fVar27 = (float)local_858;
            }
            dVar21 = dVar21 + 1;
            uVar18 = local_6f8;
            dVar19 = local_848.m_binding;
            uVar10 = local_828;
            iVar9 = (int)local_790;
          }
          iVar9 = iVar9 + 1;
        }
        uVar10 = uVar10 + 1;
      }
    }
    uVar10 = (int)uVar18 + 1;
  }
  lVar17 = 0;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2;
  local_830 = SUB168(auVar3 / ZEXT816(10),0);
  uVar10 = SUB164(auVar3 / ZEXT816(10),0);
  uVar18 = 0;
  if (0 < (int)uVar10) {
    uVar18 = (ulong)uVar10;
  }
  iVar9 = 0;
  for (; primitiveType = (TessPrimitiveType)pCVar7, uVar18 * 10 - lVar17 != 0; lVar17 = lVar17 + 10)
  {
    iVar25 = referenceVertexCount
                       (primitiveType,(SpacingMode)local_738,true,
                        attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start + (int)lVar17,
                        attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start + ((int)lVar17 + 2));
    iVar9 = iVar9 + iVar25;
  }
  lVar17 = 0x200000000;
  uVar24 = uVar18;
  while (bVar26 = uVar24 != 0, uVar24 = uVar24 - 1, bVar26) {
    isPatchDiscarded(primitiveType,
                     (float *)((lVar17 >> 0x1e) +
                              (long)attributes.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start));
    lVar17 = lVar17 + 0xa00000000;
  }
  TVar14 = ::vk::mapVkFormat(VK_FORMAT_R32_SFLOAT);
  iVar25 = tcu::getPixelSize(TVar14);
  local_810 = CONCAT44(local_810._4_4_,iVar25);
  bufferSize = (long)attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start;
  makeBufferCreateInfo((VkBufferCreateInfo *)choices,bufferSize,0x80);
  pVVar4 = local_850;
  tessellation::Buffer::Buffer
            (&vertexBuffer,local_818,local_850,allocator,(VkBufferCreateInfo *)choices,
             (MemoryRequirement)0x1);
  memcpy((vertexBuffer.m_allocation.
          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
         m_hostPtr,
         attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_start,bufferSize);
  pDVar5 = local_818;
  ::vk::flushMappedMemoryRange
            (local_818,pVVar4,
             (VkDeviceMemory)
             ((vertexBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (vertexBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,bufferSize);
  makeBufferCreateInfo((VkBufferCreateInfo *)choices,4,0x20);
  pCVar7 = local_700;
  pVVar4 = local_850;
  tessellation::Buffer::Buffer
            (&resultBuffer,pDVar5,local_850,allocator,(VkBufferCreateInfo *)choices,
             (MemoryRequirement)0x1);
  *(undefined4 *)
   (resultBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr)->m_hostPtr = 0;
  ::vk::flushMappedMemoryRange
            (pDVar5,pVVar4,
             (VkDeviceMemory)
             ((resultBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (resultBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,4);
  renderSize.m_data[0] = 0x100;
  renderSize.m_data[1] = 0x100;
  makeImageCreateInfo((VkImageCreateInfo *)choices,&renderSize,VK_FORMAT_R8G8B8A8_UNORM,0x11,1);
  Image::Image(&colorAttachmentImage,pDVar5,pVVar4,allocator,(VkImageCreateInfo *)choices,
               (MemoryRequirement)0x0);
  iVar23 = renderSize.m_data[1] * renderSize.m_data[0];
  TVar14 = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  iVar25 = tcu::getPixelSize(TVar14);
  local_858 = (VkDeviceSize)(iVar23 * iVar25);
  makeBufferCreateInfo((VkBufferCreateInfo *)choices,local_858,2);
  pVVar4 = local_850;
  tessellation::Buffer::Buffer
            (&colorBuffer,pDVar5,local_850,allocator,(VkBufferCreateInfo *)choices,
             (MemoryRequirement)0x1);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)choices);
  this_01 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      ((DescriptorSetLayoutBuilder *)choices,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,4);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)local_1b8,this_01,pDVar5,pVVar4,0);
  local_458.m_data.deleter.m_device = (VkDevice)local_1a8[0]._0_8_;
  local_458.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_1a8[0]._8_8_;
  local_458.m_data.object.m_internal = (deUint64)local_1b8;
  local_458.m_data.deleter.m_deviceIface = (DeviceInterface *)uStack_1b0;
  local_1b8._0_4_ = 0;
  local_1b8._4_4_ = 0;
  uStack_1b0 = (pointer)0x0;
  local_1a8[0]._M_allocated_capacity = (pointer)0x0;
  local_1a8[0]._8_8_ = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_1b8);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)choices);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)local_1b8);
  this_02 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)local_1b8,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)choices,this_02,pDVar5,pVVar4,1,1);
  local_378.m_data.deleter.m_device = (VkDevice)choices[1]._4_8_;
  local_378.m_data.deleter.m_allocator = (VkAllocationCallbacks *)choices[2]._0_8_;
  local_378.m_data.object.m_internal._0_4_ = choices[0][0];
  local_378.m_data.object.m_internal._4_4_ = choices[0][1];
  local_378.m_data.deleter.m_deviceIface = (DeviceInterface *)choices._8_8_;
  choices[0][0] = 0.0;
  choices[0][1] = 0.0;
  choices[0][2] = 0.0;
  choices[1][0] = 0.0;
  choices[1][1] = 0.0;
  choices[1][2] = 0.0;
  choices[2][0] = 0.0;
  choices[2][1] = 0.0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)21>_> *)choices);
  std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
  ~_Vector_base((_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *
                )local_1b8);
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)choices,pDVar5,pVVar4,
                    (VkDescriptorPool)local_378.m_data.object.m_internal,
                    (VkDescriptorSetLayout)local_458.m_data.object.m_internal);
  local_478.m_data.deleter.m_device = (VkDevice)choices[1]._4_8_;
  local_478.m_data.deleter.m_pool.m_internal._0_4_ = choices[2][0];
  local_478.m_data.deleter.m_pool.m_internal._4_4_ = choices[2][1];
  local_478.m_data.object.m_internal._0_4_ = choices[0][0];
  local_478.m_data.object.m_internal._4_4_ = choices[0][1];
  local_478.m_data.deleter.m_deviceIface = (DeviceInterface *)choices._8_8_;
  choices[0][0] = 0.0;
  choices[0][1] = 0.0;
  choices[0][2] = 0.0;
  choices[1][0] = 0.0;
  choices[1][1] = 0.0;
  choices[1][2] = 0.0;
  choices[2][0] = 0.0;
  choices[2][1] = 0.0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)22>_> *)choices);
  resultBufferInfo.buffer.m_internal =
       resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  resultBufferInfo.offset = 0;
  resultBufferInfo.range = 4;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)choices);
  local_1b8._0_4_ = 0;
  local_1b8._4_4_ = 0;
  this_03 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      ((DescriptorSetUpdateBuilder *)choices,
                       (VkDescriptorSet)local_478.m_data.object.m_internal,(Location *)local_1b8,
                       VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,&resultBufferInfo);
  ::vk::DescriptorSetUpdateBuilder::update(this_03,pDVar5,pVVar4);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)choices);
  subresourceRange.levelCount = 1;
  subresourceRange.aspectMask = 1;
  subresourceRange.baseMipLevel = 0;
  subresourceRange.baseArrayLayer = 0;
  subresourceRange.layerCount = 1;
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)choices,pDVar5,pVVar4,
                (VkImage)colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                         m_data.object.m_internal,VK_IMAGE_VIEW_TYPE_2D,VK_FORMAT_R8G8B8A8_UNORM,
                subresourceRange);
  local_398.m_data.deleter.m_device = (VkDevice)choices[1]._4_8_;
  local_398.m_data.deleter.m_allocator = (VkAllocationCallbacks *)choices[2]._0_8_;
  local_398.m_data.object.m_internal._0_4_ = choices[0][0];
  local_398.m_data.object.m_internal._4_4_ = choices[0][1];
  local_398.m_data.deleter.m_deviceIface = (DeviceInterface *)choices._8_8_;
  choices[0][0] = 0.0;
  choices[0][1] = 0.0;
  choices[0][2] = 0.0;
  choices[1][0] = 0.0;
  choices[1][1] = 0.0;
  choices[1][2] = 0.0;
  choices[2][0] = 0.0;
  choices[2][1] = 0.0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)13>_> *)choices);
  makeRenderPass((Move<vk::Handle<(vk::HandleType)17>_> *)choices,pDVar5,pVVar4,
                 VK_FORMAT_R8G8B8A8_UNORM);
  local_6c8.m_data.deleter.m_device = (VkDevice)choices[1]._4_8_;
  local_6c8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)choices[2]._0_8_;
  local_6c8.m_data.object.m_internal._0_4_ = choices[0][0];
  local_6c8.m_data.object.m_internal._4_4_ = choices[0][1];
  local_6c8.m_data.deleter.m_deviceIface = (DeviceInterface *)choices._8_8_;
  choices[0][0] = 0.0;
  choices[0][1] = 0.0;
  choices[0][2] = 0.0;
  choices[1][0] = 0.0;
  choices[1][1] = 0.0;
  choices[1][2] = 0.0;
  choices[2][0] = 0.0;
  choices[2][1] = 0.0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)17>_> *)choices);
  makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)choices,pDVar5,pVVar4,
                  (VkRenderPass)local_6c8.m_data.object.m_internal,
                  (VkImageView)local_398.m_data.object.m_internal,renderSize.m_data[0],
                  renderSize.m_data[1],1);
  local_3b8.m_data.deleter.m_device = (VkDevice)choices[1]._4_8_;
  local_3b8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)choices[2]._0_8_;
  local_3b8.m_data.object.m_internal._0_4_ = choices[0][0];
  local_3b8.m_data.object.m_internal._4_4_ = choices[0][1];
  local_3b8.m_data.deleter.m_deviceIface = (DeviceInterface *)choices._8_8_;
  choices[0][0] = 0.0;
  choices[0][1] = 0.0;
  choices[0][2] = 0.0;
  choices[1][0] = 0.0;
  choices[1][1] = 0.0;
  choices[1][2] = 0.0;
  choices[2][0] = 0.0;
  choices[2][1] = 0.0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)23>_> *)choices);
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)choices,pDVar5,pVVar4,
                     (VkDescriptorSetLayout)local_458.m_data.object.m_internal);
  local_498.m_data.deleter.m_device = (VkDevice)choices[1]._4_8_;
  local_498.m_data.deleter.m_allocator = (VkAllocationCallbacks *)choices[2]._0_8_;
  local_498.m_data.object.m_internal._0_4_ = choices[0][0];
  local_498.m_data.object.m_internal._4_4_ = choices[0][1];
  local_498.m_data.deleter.m_deviceIface = (DeviceInterface *)choices._8_8_;
  choices[0][0] = 0.0;
  choices[0][1] = 0.0;
  choices[0][2] = 0.0;
  choices[1][0] = 0.0;
  choices[1][1] = 0.0;
  choices[1][2] = 0.0;
  choices[2][0] = 0.0;
  choices[2][1] = 0.0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)choices);
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)choices,pDVar5,pVVar4,local_784);
  local_3d8.m_data.deleter.m_device = (VkDevice)choices[1]._4_8_;
  local_3d8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)choices[2]._0_8_;
  local_3d8.m_data.object.m_internal._0_4_ = choices[0][0];
  local_3d8.m_data.object.m_internal._4_4_ = choices[0][1];
  local_3d8.m_data.deleter.m_deviceIface = (DeviceInterface *)choices._8_8_;
  choices[0][0] = 0.0;
  choices[0][1] = 0.0;
  choices[0][2] = 0.0;
  choices[1][0] = 0.0;
  choices[1][1] = 0.0;
  choices[1][2] = 0.0;
  choices[2][0] = 0.0;
  choices[2][1] = 0.0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)choices);
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)choices,pDVar5,pVVar4,
             (VkCommandPool)local_3d8.m_data.object.m_internal,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_7d8.m_data.deleter.m_device = (VkDevice)choices[1]._4_8_;
  local_7d8.m_data.deleter.m_pool.m_internal._0_4_ = choices[2][0];
  local_7d8.m_data.deleter.m_pool.m_internal._4_4_ = choices[2][1];
  local_7d8.m_data.object = (VkCommandBuffer_s *)choices[0]._0_8_;
  local_7d8.m_data.deleter.m_deviceIface = (DeviceInterface *)choices._8_8_;
  choices[0][0] = 0.0;
  choices[0][1] = 0.0;
  choices[0][2] = 0.0;
  choices[1][0] = 0.0;
  choices[1][1] = 0.0;
  choices[1][2] = 0.0;
  choices[2][0] = 0.0;
  choices[2][1] = 0.0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)choices);
  pIVar11 = Context::getInstanceInterface(pCVar7);
  pVVar12 = Context::getPhysicalDevice(pCVar7);
  ::vk::getPhysicalDeviceFeatures((VkPhysicalDeviceFeatures *)choices,pIVar11,pVVar12);
  memset(choices[0] + 2,0,0xf4);
  choices[0][0] = (float)renderSize.m_data[0];
  choices[0][1] = (float)renderSize.m_data[1];
  pGVar15 = GraphicsPipelineBuilder::setVertexInputSingleAttribute
                      ((GraphicsPipelineBuilder *)choices,VK_FORMAT_R32_SFLOAT,(deUint32)local_810);
  pPVar2 = pCVar7->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&imagePixelAccess,"vert",(allocator<char> *)&local_730);
  pPVar16 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar2,(string *)&imagePixelAccess);
  pGVar15 = GraphicsPipelineBuilder::setShader
                      (pGVar15,local_818,local_850,VK_SHADER_STAGE_VERTEX_BIT,pPVar16,
                       (VkSpecializationInfo *)0x0);
  pPVar2 = pCVar7->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7b8,"tesc",(allocator<char> *)&local_318);
  pPVar16 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar2,&local_7b8);
  pGVar15 = GraphicsPipelineBuilder::setShader
                      (pGVar15,local_818,local_850,VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,pPVar16,
                       (VkSpecializationInfo *)0x0);
  pPVar2 = pCVar7->m_progCollection;
  pcVar20 = "tese";
  if ((local_60c != 0.0 & (byte)(local_798 >> 0x20) & 1) != 0) {
    pcVar20 = "tese_psw";
  }
  local_798 = local_798 >> 0x20;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_760,pcVar20,(allocator<char> *)&local_338);
  pPVar16 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar2,&local_760);
  pDVar5 = local_818;
  pGVar15 = GraphicsPipelineBuilder::setShader
                      (pGVar15,local_818,local_850,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,
                       pPVar16,(VkSpecializationInfo *)0x0);
  pPVar2 = pCVar7->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_780,"frag",(allocator<char> *)&local_358);
  pPVar16 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar2,&local_780);
  pGVar15 = GraphicsPipelineBuilder::setShader
                      (pGVar15,pDVar5,local_850,VK_SHADER_STAGE_FRAGMENT_BIT,pPVar16,
                       (VkSpecializationInfo *)0x0);
  GraphicsPipelineBuilder::build
            ((Move<vk::Handle<(vk::HandleType)18>_> *)local_1b8,pGVar15,pDVar5,local_850,
             (VkPipelineLayout)local_498.m_data.object.m_internal,
             (VkRenderPass)local_6c8.m_data.object.m_internal);
  local_3f8.m_data.deleter.m_device = (VkDevice)local_1a8[0]._0_8_;
  local_3f8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_1a8[0]._8_8_;
  local_3f8.m_data.object.m_internal = (deUint64)local_1b8;
  local_3f8.m_data.deleter.m_deviceIface = (DeviceInterface *)uStack_1b0;
  local_1b8._0_4_ = 0;
  local_1b8._4_4_ = 0;
  uStack_1b0 = (pointer)0x0;
  local_1a8[0]._M_allocated_capacity = (pointer)0x0;
  local_1a8[0]._8_8_ = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_1b8);
  std::__cxx11::string::~string((string *)&local_780);
  std::__cxx11::string::~string((string *)&local_760);
  std::__cxx11::string::~string((string *)&local_7b8);
  std::__cxx11::string::~string((string *)&imagePixelAccess);
  GraphicsPipelineBuilder::~GraphicsPipelineBuilder((GraphicsPipelineBuilder *)choices);
  choices[0]._0_8_ = pCVar7->m_testCtx->m_log;
  poVar1 = (ostringstream *)(choices[0] + 2);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Note: rendering ");
  std::ostream::operator<<(poVar1,(int)local_830);
  std::operator<<((ostream *)poVar1," patches; first patches have valid relevant outer levels, ");
  std::operator<<((ostream *)poVar1,
                  "but later patches have one or more invalid (i.e. less than or equal to 0.0) relevant outer levels"
                 );
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)choices,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  beginCommandBuffer(pDVar5,local_7d8.m_data.object);
  pVVar4 = local_850;
  subresourceRange_00.levelCount = 1;
  subresourceRange_00.aspectMask = 1;
  subresourceRange_00.baseMipLevel = 0;
  subresourceRange_00.baseArrayLayer = 0;
  subresourceRange_00.layerCount = 1;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)choices,0,0x100,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
             (VkImage)colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                      m_data.object.m_internal,subresourceRange_00);
  (*pDVar5->_vptr_DeviceInterface[0x6d])
            (pDVar5,local_7d8.m_data.object,1,0x80,0,0,0,0,0,1,(VkImageMemoryBarrier *)choices);
  choices[0][0] = 0.0;
  choices[0][1] = 0.0;
  choices[0][2] = (float)renderSize.m_data[0];
  choices[1][0] = (float)renderSize.m_data[1];
  local_1b8._0_4_ = 0;
  local_1b8._4_4_ = 0;
  uStack_1b0 = (pointer)0x3f80000000000000;
  beginRenderPass(pDVar5,local_7d8.m_data.object,(VkRenderPass)local_6c8.m_data.object.m_internal,
                  (VkFramebuffer)local_3b8.m_data.object.m_internal,(VkRect2D *)choices,
                  (Vec4 *)local_1b8);
  (*pDVar5->_vptr_DeviceInterface[0x4c])
            (pDVar5,local_7d8.m_data.object,0,local_3f8.m_data.object.m_internal);
  (*pDVar5->_vptr_DeviceInterface[0x56])
            (pDVar5,local_7d8.m_data.object,0,local_498.m_data.object.m_internal,0,1,(int)&local_478
             ,0,0);
  choices[0][0] = 0.0;
  choices[0][1] = 0.0;
  (*pDVar5->_vptr_DeviceInterface[0x58])(pDVar5,local_7d8.m_data.object,0,1,&vertexBuffer);
  (*pDVar5->_vptr_DeviceInterface[0x59])
            (pDVar5,local_7d8.m_data.object,
             (ulong)((long)attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2,1,0,0);
  endRenderPass(pDVar5,local_7d8.m_data.object);
  subresourceRange_01.levelCount = 1;
  subresourceRange_01.aspectMask = 1;
  subresourceRange_01.baseMipLevel = 0;
  subresourceRange_01.baseArrayLayer = 0;
  subresourceRange_01.layerCount = 1;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)choices,0x100,0x800,VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
             VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
             (VkImage)colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                      m_data.object.m_internal,subresourceRange_01);
  (*pDVar5->_vptr_DeviceInterface[0x6d])
            (pDVar5,local_7d8.m_data.object,0x400,0x1000,0,0,0,0,0,1,(VkImageMemoryBarrier *)choices
            );
  extent.depth = 1;
  extent.width = renderSize.m_data[0];
  extent.height = renderSize.m_data[1];
  subresourceLayers.baseArrayLayer = 0;
  subresourceLayers.layerCount = 1;
  subresourceLayers.aspectMask = 1;
  subresourceLayers.mipLevel = 0;
  makeBufferImageCopy((VkBufferImageCopy *)choices,extent,subresourceLayers);
  (*pDVar5->_vptr_DeviceInterface[99])
            (pDVar5,local_7d8.m_data.object,
             colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
             object.m_internal,6,
             colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,1,(int)(VkBufferImageCopy *)choices);
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)choices,0x1000,0x2000,
             (VkBuffer)
             colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,local_858);
  (*pDVar5->_vptr_DeviceInterface[0x6d])
            (pDVar5,local_7d8.m_data.object,0x1000,0x4000,0,0,0,1,
             (int)(VkBufferMemoryBarrier *)choices,0,0);
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)choices,0x40,0x2000,
             (VkBuffer)
             resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,4);
  (*pDVar5->_vptr_DeviceInterface[0x6d])
            (pDVar5,local_7d8.m_data.object,0x8000,0x4000,0,0,0,1,
             (int)(VkBufferMemoryBarrier *)choices,0,0);
  endCommandBuffer(pDVar5,local_7d8.m_data.object);
  submitCommandsAndWait(pDVar5,pVVar4,local_708,local_7d8.m_data.object);
  ::vk::invalidateMappedMemoryRange
            (pDVar5,pVVar4,
             (VkDeviceMemory)
             ((colorBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (colorBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,local_858);
  choices[0]._0_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&imagePixelAccess,(TextureFormat *)choices,renderSize.m_data[0],renderSize.m_data[1],1,
             (colorBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_hostPtr);
  local_848 = (Location)pCVar7->m_testCtx->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b8,"color0",(allocator<char> *)&local_760);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7b8,"Rendered image",(allocator<char> *)&local_780);
  uVar24 = local_798;
  access = &imagePixelAccess;
  tcu::LogImage::LogImage
            ((LogImage *)choices,(string *)local_1b8,&local_7b8,access,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)choices,local_848.m_binding,__buf,(size_t)access);
  tcu::LogImage::~LogImage((LogImage *)choices);
  std::__cxx11::string::~string((string *)&local_7b8);
  std::__cxx11::string::~string((string *)local_1b8);
  ::vk::invalidateMappedMemoryRange
            (pDVar5,pVVar4,
             (VkDeviceMemory)
             ((resultBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (resultBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,4);
  iVar25 = *(resultBuffer.m_allocation.
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
            m_hostPtr;
  if ((byte)(local_738 == 1 & (byte)local_710 & 1 &
            primitiveType < TESSPRIMITIVETYPE_ISOLINES & (byte)uVar24) == 1) {
    poVar1 = (ostringstream *)(choices[0] + 2);
    choices[0][0] = (float)local_848.m_binding;
    choices[0][1] = (float)local_848.m_arrayElement;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Note: shader invocations generated ");
    std::ostream::operator<<(poVar1,iVar25);
    std::operator<<((ostream *)poVar1,
                    " vertices (not verified as number of vertices is implementation-dependent)");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)choices,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    poVar1 = (ostringstream *)(choices[0] + 2);
    if (iVar25 < iVar9) {
      choices[0][0] = (float)local_848.m_binding;
      choices[0][1] = (float)local_848.m_arrayElement;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Failure: expected ");
      std::ostream::operator<<(poVar1,iVar9);
      std::operator<<((ostream *)poVar1," vertices from shader invocations, but got only ");
      std::ostream::operator<<(poVar1,iVar25);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)choices,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)choices,"Wrong number of tessellation coordinates",
                 (allocator<char> *)local_1b8);
      __return_storage_ptr___00 = local_820;
      tcu::TestStatus::fail(local_820,(string *)choices);
      goto LAB_00704991;
    }
    if (iVar25 - iVar9 == 0) {
      choices[0][0] = (float)local_848.m_binding;
      choices[0][1] = (float)local_848.m_arrayElement;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Note: shader invocations generated ");
      std::ostream::operator<<(poVar1,iVar9);
      std::operator<<((ostream *)poVar1," vertices");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)choices,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      choices[0][0] = (float)local_848.m_binding;
      choices[0][1] = (float)local_848.m_arrayElement;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Note: shader invocations generated ");
      std::ostream::operator<<(poVar1,iVar25);
      std::operator<<((ostream *)poVar1," vertices (expected ");
      std::ostream::operator<<(poVar1,iVar9);
      std::operator<<((ostream *)poVar1,", got ");
      std::ostream::operator<<(poVar1,iVar25 - iVar9);
      std::operator<<((ostream *)poVar1," extra)");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)choices,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(choices[0] + 2));
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_6f0,&imagePixelAccess);
  local_288.m_data[0] = 0.0;
  local_288.m_data[1] = 0.0;
  local_288.m_data[2] = 0.0;
  local_288.m_data[3] = 1.0;
  lastWhitePixelRow = 0;
  local_298 = &DAT_3f8000003f800000;
  puStack_290 = &DAT_3f8000003f800000;
  secondToLastWhitePixelRow = 0;
  lastWhitePixelColumnOnSecondToLastWhitePixelRow = 0;
  uVar24 = 0;
  do {
    pfVar6 = attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (uVar24 == uVar18) goto LAB_00704588;
    lVar17 = (long)(uVar24 * 0xa00000000) >> 0x1e;
    bVar26 = isPatchDiscarded((TessPrimitiveType)local_740,
                              (float *)((long)attributes.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_start + lVar17 + 8)
                             );
    if (bVar26) {
      for (iVar9 = 0; iVar9 < local_6f0.m_size.m_data[1]; iVar9 = iVar9 + 1) {
        for (iVar25 = 0; iVar25 < local_6f0.m_size.m_data[0]; iVar25 = iVar25 + 1) {
          if ((lastWhitePixelRow < iVar9) ||
             ((secondToLastWhitePixelRow < iVar9 &&
              (lastWhitePixelColumnOnSecondToLastWhitePixelRow < iVar25)))) {
            tcu::ConstPixelBufferAccess::getPixel
                      ((ConstPixelBufferAccess *)choices,(int)&local_6f0,iVar25,iVar9);
            bVar26 = tcu::Vector<float,_4>::operator!=((Vector<float,_4> *)choices,&local_288);
            if (bVar26) {
              local_1b8._0_4_ = local_848.m_binding;
              local_1b8._4_4_ = local_848.m_arrayElement;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1b0);
              std::operator<<((ostream *)&uStack_1b0,
                              "Failure: expected all pixels to be black in the area ");
              iVar23 = lastWhitePixelColumnOnSecondToLastWhitePixelRow;
              if (lastWhitePixelColumnOnSecondToLastWhitePixelRow < local_6f0.m_size.m_data[0] + -1)
              {
                local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
                local_1e0._M_string_length = 0;
                local_1e0.field_2._M_local_buf[0] = '\0';
                std::operator+(&local_358,&local_1e0,"y > ");
                de::toString<int>(&local_200,&lastWhitePixelRow);
                std::operator+(&local_338,&local_358,&local_200);
                std::operator+(&local_318,&local_338," || (y > ");
                de::toString<int>(&local_220,&secondToLastWhitePixelRow);
                std::operator+(&local_730,&local_318,&local_220);
                std::operator+(&local_780,&local_730," && x > ");
                de::toString<int>(&local_240,&lastWhitePixelColumnOnSecondToLastWhitePixelRow);
                std::operator+(&local_760,&local_780,&local_240);
                std::operator+(&local_7b8,&local_760,")");
              }
              else {
                local_780._M_dataplus._M_p = (pointer)&local_780.field_2;
                local_780._M_string_length = 0;
                local_780.field_2._M_local_buf[0] = '\0';
                std::operator+(&local_760,&local_780,"y > ");
                de::toString<int>(&local_730,&lastWhitePixelRow);
                std::operator+(&local_7b8,&local_760,&local_730);
              }
              std::operator<<((ostream *)&uStack_1b0,(string *)&local_7b8);
              std::operator<<((ostream *)&uStack_1b0,
                              " (they all correspond to patches that should be discarded)");
              choices[0]._0_8_ =
                   tcu::MessageBuilder::operator<<
                             ((MessageBuilder *)local_1b8,
                              (EndMessageToken *)&tcu::TestLog::EndMessage);
              poVar1 = (ostringstream *)(choices[0] + 2);
              std::__cxx11::ostringstream::ostringstream(poVar1);
              std::operator<<((ostream *)poVar1,"Note: pixel ");
              local_1c0.m_data[0] = iVar25;
              local_1c0.m_data[1] = iVar9;
              tcu::operator<<((ostream *)poVar1,&local_1c0);
              std::operator<<((ostream *)poVar1," isn\'t black");
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)choices,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(poVar1);
              std::__cxx11::string::~string((string *)&local_7b8);
              if (iVar23 < local_6f0.m_size.m_data[0] + -1) {
                std::__cxx11::string::~string((string *)&local_760);
                std::__cxx11::string::~string((string *)&local_240);
                std::__cxx11::string::~string((string *)&local_780);
                std::__cxx11::string::~string((string *)&local_730);
                std::__cxx11::string::~string((string *)&local_220);
                std::__cxx11::string::~string((string *)&local_318);
                std::__cxx11::string::~string((string *)&local_338);
                std::__cxx11::string::~string((string *)&local_200);
                std::__cxx11::string::~string((string *)&local_358);
                this_04 = &local_1e0;
              }
              else {
                std::__cxx11::string::~string((string *)&local_730);
                std::__cxx11::string::~string((string *)&local_760);
                this_04 = &local_780;
              }
              std::__cxx11::string::~string((string *)this_04);
              __return_storage_ptr___00 = local_820;
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1b0);
              goto LAB_00704965;
            }
          }
        }
      }
LAB_00704588:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)choices,"OK",(allocator<char> *)local_1b8);
      __return_storage_ptr___00 = local_820;
      tcu::TestStatus::pass(local_820,(string *)choices);
      goto LAB_00704991;
    }
    local_790 = (tessellation *)((long)pfVar6 + lVar17);
    uVar10 = (int)((*(float *)(local_790 + 0x1c) + *(float *)(local_790 + 0x24) + 1.0) * 0.5 *
                  (float)local_6f0.m_size.m_data[1]) + 1;
    outer = (float *)(ulong)uVar10;
    local_858 = CONCAT44(local_858._4_4_,uVar10);
    if (lastWhitePixelRow < (int)uVar10) {
      secondToLastWhitePixelRow = lastWhitePixelRow;
      lastWhitePixelRow = uVar10;
    }
    local_830 = CONCAT44(local_830._4_4_,
                         (int)((*(float *)(local_790 + 0x20) + 1.0) * 0.5 *
                              (float)local_6f0.m_size.m_data[0]) + -1);
    iVar9 = (int)((*(float *)(local_790 + 0x18) + *(float *)(local_790 + 0x20) + 1.0) * 0.5 *
                 (float)local_6f0.m_size.m_data[0]) + 1;
    uVar10 = (int)((*(float *)(local_790 + 0x24) + 1.0) * 0.5 * (float)local_6f0.m_size.m_data[1]) -
             1;
    bVar26 = false;
    lastWhitePixelColumnOnSecondToLastWhitePixelRow = iVar9;
    local_828 = uVar10;
    local_810 = uVar24;
    while (((int)uVar10 <= (int)(float)local_858 && (!bVar26))) {
      iVar25 = (int)(float)local_830;
      while ((iVar25 <= iVar9 && (!bVar26))) {
        if ((((-1 < iVar25) && (iVar25 < local_6f0.m_size.m_data[0])) && (-1 < (int)uVar10)) &&
           ((int)uVar10 < local_6f0.m_size.m_data[1])) {
          outer = (float *)(ulong)uVar10;
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)choices,(int)&local_6f0,iVar25,uVar10);
          bVar8 = tcu::Vector<float,_4>::operator==
                            ((Vector<float,_4> *)choices,(Vector<float,_4> *)&local_298);
          bVar26 = false;
          if (bVar8) {
            bVar26 = true;
          }
        }
        iVar25 = iVar25 + 1;
      }
      uVar10 = uVar10 + 1;
    }
    uVar24 = local_810 + 1;
  } while (bVar26);
  local_1b8._0_4_ = local_848.m_binding;
  local_1b8._4_4_ = local_848.m_arrayElement;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1b0);
  std::operator<<((ostream *)&uStack_1b0,
                  "Failure: expected at least one white pixel in the rectangle ");
  this_00 = local_790;
  std::operator<<((ostream *)&uStack_1b0,"[x0=");
  std::ostream::operator<<((ostringstream *)&uStack_1b0,(int)(float)local_830);
  std::operator<<((ostream *)&uStack_1b0,", y0=");
  std::ostream::operator<<((ostringstream *)&uStack_1b0,local_828);
  std::operator<<((ostream *)&uStack_1b0,", x1=");
  std::ostream::operator<<((ostringstream *)&uStack_1b0,iVar9);
  std::operator<<((ostream *)&uStack_1b0,", y1=");
  std::ostream::operator<<((ostringstream *)&uStack_1b0,(int)(float)local_858);
  std::operator<<((ostream *)&uStack_1b0,"]");
  choices[0]._0_8_ =
       tcu::MessageBuilder::operator<<
                 ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  poVar1 = (ostringstream *)(choices[0] + 2);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,
                  "Note: the rectangle approximately corresponds to the patch with these tessellation levels: "
                 );
  getTessellationLevelsString_abi_cxx11_(&local_7b8,this_00,(float *)(this_00 + 4),outer);
  std::operator<<((ostream *)poVar1,(string *)&local_7b8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)choices,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&local_7b8);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1b0);
  __return_storage_ptr___00 = local_820;
LAB_00704965:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)choices,"Image verification failed",(allocator<char> *)local_1b8);
  tcu::TestStatus::fail(__return_storage_ptr___00,(string *)choices);
LAB_00704991:
  std::__cxx11::string::~string((string *)choices);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_3f8);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_7d8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_3d8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase(&local_498);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase(&local_3b8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase(&local_6c8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase(&local_398);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase(&local_478);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase(&local_378);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase(&local_458);
  tessellation::Buffer::~Buffer(&colorBuffer);
  Image::~Image(&colorAttachmentImage);
  tessellation::Buffer::~Buffer(&resultBuffer);
  tessellation::Buffer::~Buffer(&vertexBuffer);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&attributes.super__Vector_base<float,_std::allocator<float>_>);
  return __return_storage_ptr___00;
}

Assistant:

tcu::TestStatus test (Context& context, const CaseDefinition caseDef)
{
	requireFeatures(context.getInstanceInterface(), context.getPhysicalDevice(), FEATURE_TESSELLATION_SHADER | FEATURE_VERTEX_PIPELINE_STORES_AND_ATOMICS);

	const DeviceInterface&	vk					= context.getDeviceInterface();
	const VkDevice			device				= context.getDevice();
	const VkQueue			queue				= context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= context.getDefaultAllocator();

	const std::vector<float>	attributes				= genAttributes(caseDef.useLessThanOneInnerLevels);
	const int					numAttribsPerPrimitive	= 6 + 2 + 2; // Tess levels, scale, offset.
	const int					numPrimitives			= static_cast<int>(attributes.size() / numAttribsPerPrimitive);
	const int					numExpectedVertices		= expectedVertexCount(numPrimitives, numAttribsPerPrimitive, caseDef.primitiveType, caseDef.spacingMode, attributes);

	// Check the convenience assertion that all discarded patches come after the last non-discarded patch.
	{
		bool discardedPatchEncountered = false;
		for (int patchNdx = 0; patchNdx < numPrimitives; ++patchNdx)
		{
			const bool discard = isPatchDiscarded(caseDef.primitiveType, &attributes[numAttribsPerPrimitive*patchNdx + 2]);
			DE_ASSERT(discard || !discardedPatchEncountered);
			discardedPatchEncountered = discard;
		}
		DE_UNREF(discardedPatchEncountered);
	}

	// Vertex input attributes buffer

	const VkFormat	   vertexFormat		   = VK_FORMAT_R32_SFLOAT;
	const deUint32	   vertexStride		   = tcu::getPixelSize(mapVkFormat(vertexFormat));
	const VkDeviceSize vertexDataSizeBytes = sizeInBytes(attributes);
	const Buffer	   vertexBuffer		   (vk, device, allocator, makeBufferCreateInfo(vertexDataSizeBytes, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT), MemoryRequirement::HostVisible);

	DE_ASSERT(static_cast<int>(attributes.size()) == numPrimitives * numAttribsPerPrimitive);
	DE_ASSERT(sizeof(attributes[0]) == vertexStride);

	{
		const Allocation& alloc = vertexBuffer.getAllocation();
		deMemcpy(alloc.getHostPtr(), &attributes[0], static_cast<std::size_t>(vertexDataSizeBytes));
		flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), vertexDataSizeBytes);
		// No barrier needed, flushed memory is automatically visible
	}

	// Output buffer: number of invocations

	const VkDeviceSize resultBufferSizeBytes = sizeof(deInt32);
	const Buffer	   resultBuffer			 (vk, device, allocator, makeBufferCreateInfo(resultBufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	{
		const Allocation& alloc = resultBuffer.getAllocation();
		deMemset(alloc.getHostPtr(), 0, static_cast<std::size_t>(resultBufferSizeBytes));
		flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), resultBufferSizeBytes);
	}

	// Color attachment

	const tcu::IVec2			  renderSize				 = tcu::IVec2(256, 256);
	const VkFormat				  colorFormat				 = VK_FORMAT_R8G8B8A8_UNORM;
	const VkImageSubresourceRange colorImageSubresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u);
	const Image					  colorAttachmentImage		 (vk, device, allocator,
															 makeImageCreateInfo(renderSize, colorFormat, VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT, 1u),
															 MemoryRequirement::Any);

	// Color output buffer: image will be copied here for verification

	const VkDeviceSize colorBufferSizeBytes = renderSize.x()*renderSize.y() * tcu::getPixelSize(mapVkFormat(colorFormat));
	const Buffer colorBuffer(vk, device, allocator,
		makeBufferCreateInfo(colorBufferSizeBytes, VK_BUFFER_USAGE_TRANSFER_DST_BIT), MemoryRequirement::HostVisible);

	// Descriptors

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet    (makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));
	const VkDescriptorBufferInfo  resultBufferInfo = makeDescriptorBufferInfo(resultBuffer.get(), 0ull, resultBufferSizeBytes);

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &resultBufferInfo)
		.update(vk, device);

	// Pipeline

	const Unique<VkImageView>		colorAttachmentView	(makeImageView(vk, device, *colorAttachmentImage, VK_IMAGE_VIEW_TYPE_2D, colorFormat, colorImageSubresourceRange));
	const Unique<VkRenderPass>		renderPass			(makeRenderPass(vk, device, colorFormat));
	const Unique<VkFramebuffer>		framebuffer			(makeFramebuffer(vk, device, *renderPass, *colorAttachmentView, renderSize.x(), renderSize.y(), 1u));
	const Unique<VkPipelineLayout>	pipelineLayout		(makePipelineLayout(vk, device, *descriptorSetLayout));
	const Unique<VkCommandPool>		cmdPool				(makeCommandPool(vk, device, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer			(allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));
	const bool						needPointSizeWrite	= getPhysicalDeviceFeatures(context.getInstanceInterface(), context.getPhysicalDevice()).shaderTessellationAndGeometryPointSize && caseDef.usePointMode;

	const Unique<VkPipeline> pipeline(GraphicsPipelineBuilder()
		.setRenderSize				  (renderSize)
		.setPatchControlPoints		  (numAttribsPerPrimitive)
		.setVertexInputSingleAttribute(vertexFormat, vertexStride)
		.setShader					  (vk, device, VK_SHADER_STAGE_VERTEX_BIT,					context.getBinaryCollection().get("vert"), DE_NULL)
		.setShader					  (vk, device, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,	context.getBinaryCollection().get("tesc"), DE_NULL)
		.setShader					  (vk, device, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT, context.getBinaryCollection().get(needPointSizeWrite ? "tese_psw" : "tese"), DE_NULL)
		.setShader					  (vk, device, VK_SHADER_STAGE_FRAGMENT_BIT,				context.getBinaryCollection().get("frag"), DE_NULL)
		.build						  (vk, device, *pipelineLayout, *renderPass));

	context.getTestContext().getLog()
		<< tcu::TestLog::Message
		<< "Note: rendering " << numPrimitives << " patches; first patches have valid relevant outer levels, "
		<< "but later patches have one or more invalid (i.e. less than or equal to 0.0) relevant outer levels"
		<< tcu::TestLog::EndMessage;

	// Draw commands

	beginCommandBuffer(vk, *cmdBuffer);

	// Change color attachment image layout
	{
		const VkImageMemoryBarrier colorAttachmentLayoutBarrier = makeImageMemoryBarrier(
			(VkAccessFlags)0, VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,
			VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
			*colorAttachmentImage, colorImageSubresourceRange);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT, 0u,
			0u, DE_NULL, 0u, DE_NULL, 1u, &colorAttachmentLayoutBarrier);
	}

	// Begin render pass
	{
		const VkRect2D renderArea = {
			makeOffset2D(0, 0),
			makeExtent2D(renderSize.x(), renderSize.y()),
		};
		const tcu::Vec4 clearColor = tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f);

		beginRenderPass(vk, *cmdBuffer, *renderPass, *framebuffer, renderArea, clearColor);
	}

	vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
	vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);
	{
		const VkDeviceSize vertexBufferOffset = 0ull;
		vk.cmdBindVertexBuffers(*cmdBuffer, 0u, 1u, &vertexBuffer.get(), &vertexBufferOffset);
	}

	vk.cmdDraw(*cmdBuffer, static_cast<deUint32>(attributes.size()), 1u, 0u, 0u);
	endRenderPass(vk, *cmdBuffer);

	// Copy render result to a host-visible buffer
	{
		const VkImageMemoryBarrier colorAttachmentPreCopyBarrier = makeImageMemoryBarrier(
			VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT, VK_ACCESS_TRANSFER_READ_BIT,
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
			*colorAttachmentImage, colorImageSubresourceRange);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u,
			0u, DE_NULL, 0u, DE_NULL, 1u, &colorAttachmentPreCopyBarrier);
	}
	{
		const VkBufferImageCopy copyRegion = makeBufferImageCopy(makeExtent3D(renderSize.x(), renderSize.y(), 1), makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, 1u));
		vk.cmdCopyImageToBuffer(*cmdBuffer, *colorAttachmentImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *colorBuffer, 1u, &copyRegion);
	}
	{
		const VkBufferMemoryBarrier postCopyBarrier = makeBufferMemoryBarrier(
			VK_ACCESS_TRANSFER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *colorBuffer, 0ull, colorBufferSizeBytes);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
			0u, DE_NULL, 1u, &postCopyBarrier, 0u, DE_NULL);
	}
	{
		const VkBufferMemoryBarrier shaderWriteBarrier = makeBufferMemoryBarrier(
			VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *resultBuffer, 0ull, resultBufferSizeBytes);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
			0u, DE_NULL, 1u, &shaderWriteBarrier, 0u, DE_NULL);
	}

	endCommandBuffer(vk, *cmdBuffer);
	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	{
		// Log rendered image
		const Allocation& colorBufferAlloc = colorBuffer.getAllocation();
		invalidateMappedMemoryRange(vk, device, colorBufferAlloc.getMemory(), colorBufferAlloc.getOffset(), colorBufferSizeBytes);

		const tcu::ConstPixelBufferAccess imagePixelAccess(mapVkFormat(colorFormat), renderSize.x(), renderSize.y(), 1, colorBufferAlloc.getHostPtr());

		tcu::TestLog& log = context.getTestContext().getLog();
		log << tcu::TestLog::Image("color0", "Rendered image", imagePixelAccess);

		// Verify case result
		const Allocation& resultAlloc = resultBuffer.getAllocation();
		invalidateMappedMemoryRange(vk, device, resultAlloc.getMemory(), resultAlloc.getOffset(), resultBufferSizeBytes);

		const deInt32 numResultVertices = *static_cast<deInt32*>(resultAlloc.getHostPtr());

		if (!lessThanOneInnerLevelsDefined(caseDef) && caseDef.useLessThanOneInnerLevels)
		{
			// Since we cannot explicitly determine whether or not such interior vertices are going to be
			// generated, we will not verify the number of generated vertices for fractional odd + quads/triangles
			// tessellation configurations.
			log << tcu::TestLog::Message
				<< "Note: shader invocations generated " << numResultVertices << " vertices (not verified as number of vertices is implementation-dependent)"
				<< tcu::TestLog::EndMessage;
		}
		else if (numResultVertices < numExpectedVertices)
		{
			log << tcu::TestLog::Message
				<< "Failure: expected " << numExpectedVertices << " vertices from shader invocations, but got only " << numResultVertices
				<< tcu::TestLog::EndMessage;
			return tcu::TestStatus::fail("Wrong number of tessellation coordinates");
		}
		else if (numResultVertices == numExpectedVertices)
		{
			log << tcu::TestLog::Message
				<< "Note: shader invocations generated " << numResultVertices << " vertices"
				<< tcu::TestLog::EndMessage;
		}
		else
		{
			log << tcu::TestLog::Message
				<< "Note: shader invocations generated " << numResultVertices << " vertices (expected " << numExpectedVertices << ", got "
				<< (numResultVertices - numExpectedVertices) << " extra)"
				<< tcu::TestLog::EndMessage;
		}

		return (verifyResultImage(log, numPrimitives, numAttribsPerPrimitive, caseDef.primitiveType, attributes, imagePixelAccess)
				? tcu::TestStatus::pass("OK") : tcu::TestStatus::fail("Image verification failed"));
	}
}